

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

bool __thiscall
llvm::
DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>
::allocateBuckets(DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>
                  *this,uint Num)

{
  DenseSetPair<llvm::DWARFDebugNames::Abbrev> *pDVar1;
  bool bVar2;
  uint Num_local;
  DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>
  *this_local;
  
  this->NumBuckets = Num;
  bVar2 = this->NumBuckets != 0;
  if (bVar2) {
    pDVar1 = (DenseSetPair<llvm::DWARFDebugNames::Abbrev> *)
             allocate_buffer((ulong)this->NumBuckets << 5,8);
    this->Buckets = pDVar1;
  }
  else {
    this->Buckets = (DenseSetPair<llvm::DWARFDebugNames::Abbrev> *)0x0;
  }
  return bVar2;
}

Assistant:

bool allocateBuckets(unsigned Num) {
    NumBuckets = Num;
    if (NumBuckets == 0) {
      Buckets = nullptr;
      return false;
    }

    Buckets = static_cast<BucketT *>(
        allocate_buffer(sizeof(BucketT) * NumBuckets, alignof(BucketT)));
    return true;
  }